

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O2

void * tcg_malloc(TCGContext_conflict9 *tcg_ctx,int size)

{
  uint8_t *puVar1;
  int size_00;
  void *pvVar2;
  uint8_t *puVar3;
  
  size_00 = (size + 7) / 8 << 3;
  puVar1 = tcg_ctx->pool_cur;
  puVar3 = puVar1 + size_00;
  if (puVar3 <= tcg_ctx->pool_end) {
    tcg_ctx->pool_cur = puVar3;
    return puVar1;
  }
  pvVar2 = tcg_malloc_internal_tricore(tcg_ctx,size_00);
  return pvVar2;
}

Assistant:

static inline void *tcg_malloc(TCGContext *tcg_ctx, int size)
{
    TCGContext *s = tcg_ctx;
    uint8_t *ptr, *ptr_end;

    /* ??? This is a weak placeholder for minimum malloc alignment.  */
    size = QEMU_ALIGN_UP(size, 8);

    ptr = s->pool_cur;
    ptr_end = ptr + size;
    if (unlikely(ptr_end > s->pool_end)) {
        return tcg_malloc_internal(tcg_ctx, size);
    } else {
        s->pool_cur = ptr_end;
        return ptr;
    }
}